

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
DensityCalculator<double,_float>::push_bdens_fast_route
          (DensityCalculator<double,_float> *this,double split_point,size_t col)

{
  pointer pdVar1;
  pointer pdVar2;
  iterator iVar3;
  double dVar4;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  pdVar1 = (this->box_low).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->box_high).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = pdVar2[col] - pdVar1[col];
  local_38 = (split_point - pdVar1[col]) / local_30;
  local_30 = (pdVar2[col] - split_point) / local_30;
  dVar4 = local_38;
  if (local_38 <= 2.2250738585072014e-308) {
    dVar4 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar4) {
    dVar4 = 0.9999999999999998;
  }
  local_28 = local_30;
  local_20 = split_point;
  local_38 = log(dVar4);
  iVar3._M_current =
       (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = local_38 + iVar3._M_current[-1];
  dVar4 = local_28;
  if (local_28 <= 2.2250738585072014e-308) {
    dVar4 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar4) {
    dVar4 = 0.9999999999999998;
  }
  local_30 = log(dVar4);
  local_30 = local_30 + iVar3._M_current[-1];
  if (iVar3._M_current ==
      (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this,iVar3,&local_30);
  }
  else {
    *iVar3._M_current = local_30;
    (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar3._M_current =
       (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this,iVar3,&local_38);
  }
  else {
    *iVar3._M_current = local_38;
    (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  push_bdens_internal(this,local_20,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}